

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

char * __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::PrintFractionalDigitsFast
          (anon_unknown_0 *this,uint128 v,char *start,int exp,size_t precision)

{
  char cVar1;
  char *pcVar2;
  undefined4 in_register_00000084;
  long lVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  uint64_t high;
  uint64_t low;
  unsigned_long local_40;
  unsigned_long local_38;
  
  pcVar2 = (char *)v.hi_;
  auVar5 = __ashlti3(this,v.lo_,-0x80 - (char)start);
  lVar3 = CONCAT44(in_register_00000084,exp);
  while( true ) {
    local_40 = auVar5._8_8_;
    local_38 = auVar5._0_8_;
    if ((lVar3 == 0) || (local_38 == 0)) break;
    cVar1 = MultiplyBy10WithCarry<unsigned_long>(&local_38,'\0');
    cVar1 = MultiplyBy10WithCarry<unsigned_long>(&local_40,cVar1);
    auVar5._8_8_ = local_40;
    auVar5._0_8_ = local_38;
    *pcVar2 = cVar1 + '0';
    pcVar2 = pcVar2 + 1;
    lVar3 = lVar3 + -1;
  }
  while( true ) {
    local_40 = auVar5._8_8_;
    local_38 = auVar5._0_8_;
    bVar4 = lVar3 == 0;
    lVar3 = lVar3 + -1;
    if (bVar4) {
      if ((long)local_40 < 0) {
        RoundUp(pcVar2 + -1);
      }
      return pcVar2;
    }
    if (local_40 == 0) break;
    cVar1 = MultiplyBy10WithCarry<unsigned_long>(&local_40,'\0');
    auVar5._8_8_ = local_40;
    auVar5._0_8_ = local_38;
    *pcVar2 = cVar1 + '0';
    pcVar2 = pcVar2 + 1;
  }
  return pcVar2;
}

Assistant:

char* PrintFractionalDigitsFast(uint128 v,
                                char* start,
                                int exp,
                                size_t precision) {
  char *p = start;
  v <<= (128 - exp);
  auto high = static_cast<uint64_t>(v >> 64);
  auto low = static_cast<uint64_t>(v);

  // While we have digits to print and `low` is not empty, do the long
  // multiplication.
  while (precision > 0 && low != 0) {
    char carry = MultiplyBy10WithCarry(&low, 0);
    carry = MultiplyBy10WithCarry(&high, carry);

    *p++ = carry + '0';
    --precision;
  }

  // Now `low` is empty, so use a faster approach for the rest of the digits.
  // This block is pretty much the same as the main loop for the 64-bit case
  // above.
  while (precision > 0) {
    if (!high) return p;
    *p++ = MultiplyBy10WithCarry(&high, 0) + '0';
    --precision;
  }

  // We need to round.
  if (high < 0x8000000000000000) {
    // We round down, so nothing to do.
  } else if (high > 0x8000000000000000 || low != 0) {
    // We round up.
    RoundUp(p - 1);
  } else {
    RoundToEven(p - 1);
  }

  return p;
}